

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiOutAlsa::setPortName(MidiOutAlsa *this,string *portName)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pointer pcVar4;
  long lVar5;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_30;
  undefined1 auStack_28 [8];
  
  puVar2 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  uStack_30 = 0x10ec4c;
  lVar5 = snd_seq_port_info_sizeof();
  lVar5 = -(lVar5 + 0xfU & 0xfffffffffffffff0);
  __s = auStack_28 + lVar5;
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x10ec62;
  __n = snd_seq_port_info_sizeof();
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x10ec6f;
  memset(__s,0,__n);
  uVar3 = *puVar2;
  uVar1 = *(undefined4 *)((long)puVar2 + 0xc);
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x10ec7e;
  snd_seq_get_port_info(uVar3,uVar1,__s);
  pcVar4 = (portName->_M_dataplus)._M_p;
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x10ec89;
  snd_seq_port_info_set_name(__s,pcVar4);
  uVar3 = *puVar2;
  uVar1 = *(undefined4 *)((long)puVar2 + 0xc);
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x10ec98;
  snd_seq_set_port_info(uVar3,uVar1,__s);
  return;
}

Assistant:

void MidiOutAlsa :: setPortName( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  snd_seq_port_info_t *pinfo;
  snd_seq_port_info_alloca( &pinfo );
  snd_seq_get_port_info( data->seq, data->vport, pinfo );
  snd_seq_port_info_set_name( pinfo, portName.c_str() );
  snd_seq_set_port_info( data->seq, data->vport, pinfo );
}